

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_atomics.cpp
# Opt level: O1

spv_result_t spvtools::val::AtomicsPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *this;
  ushort uVar1;
  uint32_t id;
  undefined2 uVar2;
  _Head_base<1UL,_bool,_false> _Var3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  spv_result_t sVar7;
  spv_result_t sVar8;
  DiagnosticStream *pDVar9;
  Instruction *pIVar10;
  uint operand_index;
  long lVar11;
  Op opcode;
  Op opcode_00;
  char *pcVar12;
  bool bVar13;
  uint operand_index_00;
  uint32_t data_type;
  StorageClass storage_class;
  uint32_t local_24c;
  uint32_t local_248;
  StorageClass local_244;
  string local_240;
  Op local_21c;
  ulong local_218;
  char *local_210;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  if ((((0xf < uVar1 - 0xe3) && (1 < opcode - OpAtomicFlagTestAndSet)) &&
      (1 < opcode - OpAtomicFMinEXT)) && (opcode != OpAtomicFAddEXT)) {
    return SPV_SUCCESS;
  }
  id = (inst->inst_).type_id;
  opcode_00 = (Op)uVar1;
  if (uVar1 < 0x15ee) {
    if ((uVar1 != 0xe4) && (uVar1 != 0x13f)) goto LAB_0063c789;
LAB_0063c81d:
    bVar13 = opcode != OpAtomicStore && uVar1 != 0x13f;
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)((uint)bVar13 + (uint)bVar13));
    local_24c = 0;
    bVar4 = ValidationState_t::GetPointerTypeInfo(_,uVar5,&local_24c,&local_244);
    if (!bVar4) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
      pcVar12 = ": expected Pointer to be a pointer type";
      lVar11 = 0x27;
      goto LAB_0063d231;
    }
    if (local_24c == 0) {
      if (uVar1 < 0x13e) {
        if ((opcode - OpAtomicExchange < 0xe) || (opcode == OpAtomicLoad)) {
LAB_0063c87e:
          local_24c = (inst->inst_).type_id;
        }
        else if (opcode == OpAtomicStore) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar10 = ValidationState_t::FindDef(_,uVar6);
          local_24c = (pIVar10->inst_).type_id;
        }
        goto LAB_0063c886;
      }
      if (1 < opcode - OpAtomicFlagTestAndSet) {
        if ((opcode - OpAtomicFMinEXT < 2) || (opcode == OpAtomicFAddEXT)) goto LAB_0063c87e;
        goto LAB_0063c886;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar12 = "Untyped pointers are not supported by atomic flag instructions";
      lVar11 = 0x3e;
LAB_0063cf2c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar12,lVar11);
      goto LAB_0063d243;
    }
LAB_0063c886:
    bVar4 = ValidationState_t::IsIntScalarType(_,local_24c);
    if (((bVar4) && (uVar5 = ValidationState_t::GetBitWidth(_,local_24c), uVar5 == 0x40)) &&
       (bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64Atomics),
       !bVar4)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
      pcVar12 = ": 64-bit atomics require the Int64Atomics capability";
      lVar11 = 0x34;
      goto LAB_0063d231;
    }
    if (((StorageBuffer < local_244) || ((0x1db4U >> (local_244 & 0x1f) & 1) == 0)) &&
       ((local_244 != PhysicalStorageBuffer && (local_244 != StorageClassTaskPayloadWorkgroupEXT))))
    {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
      pcVar12 = ": storage class forbidden by universal validation rules.";
      lVar11 = 0x38;
      goto LAB_0063d231;
    }
    this = &_->module_capabilities_;
    local_218 = (ulong)((uint)bVar13 + (uint)bVar13);
    bVar4 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
    if (bVar4) {
      bVar4 = spvIsVulkanEnv(_->context_->target_env);
      if (bVar4) {
        if (((local_244 < (StorageBuffer|Input)) && ((0x1814U >> (local_244 & 0x1f) & 1) != 0)) ||
           ((local_244 == PhysicalStorageBuffer ||
            (local_244 == StorageClassTaskPayloadWorkgroupEXT)))) goto LAB_0063cb6d;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_240,_,0x124e,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_240._M_dataplus._M_p,local_240._M_string_length);
        local_210 = spvOpcodeString(opcode_00);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_210);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar9,
                   ": Vulkan spec only allows storage classes for atomic to be: Uniform, Workgroup, Image, StorageBuffer, PhysicalStorageBuffer or TaskPayloadWorkgroupEXT."
                   ,0x97);
        local_38 = pDVar9->error_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0063d243;
      }
      if (local_244 == Function) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        pcVar12 = ": Function storage class forbidden when the Shader capability is declared.";
        lVar11 = 0x4a;
        goto LAB_0063d231;
      }
LAB_0063cb6d:
      if (opcode != OpAtomicFAddEXT) {
        if ((opcode & ~OpUndef) != OpAtomicFMinEXT) goto LAB_0063ced2;
        uVar5 = ValidationState_t::GetBitWidth(_,id);
        if (uVar5 == 0x10) {
          bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,id);
          if (bVar4) {
            bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat16VectorNV);
            if (!bVar4) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
              pDVar9 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_208,(char **)&local_240);
              pcVar12 = ": float vector atomics require the AtomicFloat16VectorNV capability";
              lVar11 = 0x43;
              goto LAB_0063d231;
            }
            goto LAB_0063ce8a;
          }
          bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat16MinMaxEXT);
          if (bVar4) goto LAB_0063ce8a;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
          pcVar12 = ": float min/max atomics require the AtomicFloat16MinMaxEXT capability";
        }
        else {
LAB_0063ce8a:
          uVar5 = ValidationState_t::GetBitWidth(_,id);
          if ((uVar5 != 0x20) ||
             (bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat32MinMaxEXT), bVar4)) {
            uVar5 = ValidationState_t::GetBitWidth(_,id);
            if ((uVar5 != 0x40) ||
               (bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat64MinMaxEXT), bVar4))
            goto LAB_0063ced2;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_240._M_dataplus._M_p = spvOpcodeString(opcode);
            pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240)
            ;
            pcVar12 = ": float min/max atomics require the AtomicFloat64MinMaxEXT capability";
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_240._M_dataplus._M_p = spvOpcodeString(opcode);
            pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240)
            ;
            pcVar12 = ": float min/max atomics require the AtomicFloat32MinMaxEXT capability";
          }
        }
        lVar11 = 0x45;
        goto LAB_0063d231;
      }
      uVar5 = ValidationState_t::GetBitWidth(_,id);
      if (uVar5 == 0x10) {
        bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,id);
        if (!bVar4) {
          bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat16AddEXT);
          if (bVar4) goto LAB_0063cda9;
          goto LAB_0063ce2f;
        }
        bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat16VectorNV);
        if (bVar4) goto LAB_0063cda9;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(OpAtomicFAddEXT);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        pcVar12 = ": float vector atomics require the AtomicFloat16VectorNV capability";
        lVar11 = 0x43;
      }
      else {
LAB_0063cda9:
        uVar5 = ValidationState_t::GetBitWidth(_,id);
        if ((uVar5 != 0x20) ||
           (bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat32AddEXT), bVar4)) {
          uVar5 = ValidationState_t::GetBitWidth(_,id);
          if ((uVar5 != 0x40) ||
             (bVar4 = EnumSet<spv::Capability>::contains(this,AtomicFloat64AddEXT), bVar4))
          goto LAB_0063ced2;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_240._M_dataplus._M_p = spvOpcodeString(OpAtomicFAddEXT);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
          pcVar12 = ": float add atomics require the AtomicFloat64AddEXT capability";
        }
        else {
LAB_0063ce2f:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_240._M_dataplus._M_p = spvOpcodeString(OpAtomicFAddEXT);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
          pcVar12 = ": float add atomics require the AtomicFloat32AddEXT capability";
        }
        lVar11 = 0x3e;
      }
LAB_0063d040:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9,pcVar12,lVar11);
      local_38 = pDVar9->error_;
      goto LAB_0063d243;
    }
LAB_0063ced2:
    bVar4 = spvIsOpenCLEnv(_->context_->target_env);
    if (bVar4) {
      if ((Generic < local_244) || ((0x1b0U >> (local_244 & 0x1f) & 1) == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(opcode);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        pcVar12 = 
        ": storage class must be Function, Workgroup, CrossWorkGroup or Generic in the OpenCL environment."
        ;
        lVar11 = 0x61;
        goto LAB_0063d231;
      }
      if ((local_244 == Generic) && (_->context_->target_env == SPV_ENV_OPENCL_1_2)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Storage class cannot be Generic in OpenCL 1.2 environment";
        lVar11 = 0x39;
        goto LAB_0063cf2c;
      }
    }
    if ((opcode & ~OpUndef) == OpAtomicFlagTestAndSet) {
      bVar4 = ValidationState_t::IsIntScalarType(_,local_24c);
      if ((!bVar4) || (uVar5 = ValidationState_t::GetBitWidth(_,local_24c), uVar5 != 0x20)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(opcode);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        pcVar12 = ": expected Pointer to point to a value of 32-bit integer type";
        lVar11 = 0x3d;
        goto LAB_0063d231;
      }
    }
    else if (opcode == OpAtomicStore) {
      bVar4 = ValidationState_t::IsFloatScalarType(_,local_24c);
      if ((!bVar4) && (bVar4 = ValidationState_t::IsIntScalarType(_,local_24c), !bVar4)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(OpAtomicStore);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar9,": expected Pointer to be a pointer to integer or float ",0x37)
        ;
        pcVar12 = "scalar type";
        lVar11 = 0xb;
        goto LAB_0063d040;
      }
    }
    else if (local_24c != id) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_240._M_dataplus._M_p = spvOpcodeString(opcode);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
      pcVar12 = ": expected Pointer to point to a value of type Result Type";
      lVar11 = 0x3a;
      goto LAB_0063d231;
    }
    local_21c = opcode & ~OpUndef;
    uVar6 = Instruction::GetOperandAs<unsigned_int_const>(inst,(ulong)((uint)bVar13 * 2 + 1));
    sVar7 = ValidateMemoryScope(_,inst,uVar6);
    sVar8 = sVar7;
    if (sVar7 == SPV_SUCCESS) {
      operand_index_00 = (int)local_218 + 2;
      sVar8 = ValidateMemorySemantics(_,inst,operand_index_00,uVar6);
      if (sVar8 == SPV_SUCCESS) {
        operand_index = (int)local_218 + 3;
        if (local_21c == OpAtomicCompareExchange) {
          local_248 = operand_index;
          sVar8 = ValidateMemorySemantics(_,inst,operand_index,uVar6);
          if (sVar8 == SPV_SUCCESS) {
            uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)operand_index_00);
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar6);
            _Var3._M_head_impl = local_208[4];
            uVar2 = local_208._0_2_;
            uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)local_248);
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar6);
            bVar4 = true;
            if (((_Var3._M_head_impl == true) && (local_208[4] != false)) &&
               (bVar4 = true, (short)(local_208._0_2_ ^ uVar2) < 0)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,
                         "Volatile mask setting must match for Equal and Unequal memory semantics",
                         0x47);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar4 = false;
              sVar7 = local_38;
            }
          }
          else {
            bVar4 = false;
            sVar7 = sVar8;
          }
          sVar8 = sVar7;
          if (!bVar4) goto LAB_0063d248;
          operand_index = (uint)local_218 | 4;
        }
        if (opcode == OpNoLine || uVar1 < 0x13d) {
          if ((1 < opcode - OpAtomicIIncrement) && (opcode != OpAtomicLoad)) {
            if (opcode != OpAtomicStore) goto LAB_0063d46e;
            local_248 = operand_index;
            uVar5 = ValidationState_t::GetOperandTypeId(_,inst,3);
            operand_index = local_248;
            if (uVar5 != local_24c) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              local_240._M_dataplus._M_p = spvOpcodeString(OpAtomicStore);
              pDVar9 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_208,(char **)&local_240);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar9,
                         ": expected Value type and the type pointed to by Pointer to be the same",
                         0x47);
              sVar8 = pDVar9->error_;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              goto LAB_0063d248;
            }
          }
        }
        else if (1 < opcode - OpAtomicFlagTestAndSet) {
LAB_0063d46e:
          local_248 = operand_index;
          uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)operand_index);
          if (uVar5 != id) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_240._M_dataplus._M_p = spvOpcodeString(opcode);
            pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar9,": expected Value to be of type Result Type",0x2a);
            sVar8 = pDVar9->error_;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            goto LAB_0063d248;
          }
          operand_index = local_248 + 1;
        }
        bVar4 = true;
        if (local_21c == OpAtomicCompareExchange) {
          uVar5 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)operand_index);
          bVar4 = uVar5 == id;
          if (!bVar4) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_240._M_dataplus._M_p = spvOpcodeString(opcode);
            pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar9,": expected Comparator to be of type Result Type",0x2f);
            sVar7 = pDVar9->error_;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          }
        }
        goto LAB_0063d24b;
      }
    }
  }
  else {
    if (((1 < uVar1 - 0x15ee) && (opcode != OpAtomicFAddEXT)) ||
       (((bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,AtomicFloat16VectorNV)
         , bVar4 && (bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,id), bVar4)) ||
        (bVar4 = ValidationState_t::IsFloatScalarType(_,id), bVar4)))) {
LAB_0063c789:
      if ((0xc < opcode - OpAtomicCompareExchange) ||
         (bVar4 = ValidationState_t::IsIntScalarType(_,id), bVar4)) {
        if ((((uVar1 - 0xe3 & 0xfffffffd) != 0) ||
            (bVar4 = ValidationState_t::IsFloatScalarType(_,id), bVar4)) ||
           ((((opcode == OpAtomicExchange &&
              (bVar4 = EnumSet<spv::Capability>::contains
                                 (&_->module_capabilities_,AtomicFloat16VectorNV), bVar4)) &&
             (bVar4 = ValidationState_t::IsFloat16Vector2Or4Type(_,id), bVar4)) ||
            (bVar4 = ValidationState_t::IsIntScalarType(_,id), bVar4)))) {
          if ((opcode != OpAtomicFlagTestAndSet) ||
             (bVar4 = ValidationState_t::IsBoolScalarType(_,id), bVar4)) goto LAB_0063c81d;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_240._M_dataplus._M_p = spvOpcodeString(opcode_00);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
          pcVar12 = ": expected Result Type to be bool scalar type";
          lVar11 = 0x2d;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_240._M_dataplus._M_p = spvOpcodeString(opcode);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
          pcVar12 = ": expected Result Type to be integer or float scalar type";
          lVar11 = 0x39;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_240._M_dataplus._M_p = spvOpcodeString(opcode);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
        pcVar12 = ": expected Result Type to be integer scalar type";
        lVar11 = 0x30;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_240._M_dataplus._M_p = spvOpcodeString(opcode);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_240);
      pcVar12 = ": expected Result Type to be float scalar type";
      lVar11 = 0x2e;
    }
LAB_0063d231:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9,pcVar12,lVar11);
    local_38 = pDVar9->error_;
LAB_0063d243:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar8 = local_38;
  }
LAB_0063d248:
  sVar7 = sVar8;
  bVar4 = false;
LAB_0063d24b:
  if (bVar4) {
    return SPV_SUCCESS;
  }
  return sVar7;
}

Assistant:

spv_result_t AtomicsPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpAtomicLoad:
    case spv::Op::OpAtomicStore:
    case spv::Op::OpAtomicExchange:
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicCompareExchange:
    case spv::Op::OpAtomicCompareExchangeWeak:
    case spv::Op::OpAtomicIIncrement:
    case spv::Op::OpAtomicIDecrement:
    case spv::Op::OpAtomicIAdd:
    case spv::Op::OpAtomicISub:
    case spv::Op::OpAtomicSMin:
    case spv::Op::OpAtomicUMin:
    case spv::Op::OpAtomicFMinEXT:
    case spv::Op::OpAtomicSMax:
    case spv::Op::OpAtomicUMax:
    case spv::Op::OpAtomicFMaxEXT:
    case spv::Op::OpAtomicAnd:
    case spv::Op::OpAtomicOr:
    case spv::Op::OpAtomicXor:
    case spv::Op::OpAtomicFlagTestAndSet:
    case spv::Op::OpAtomicFlagClear: {
      const uint32_t result_type = inst->type_id();

      // Validate return type first so can just check if pointer type is same
      // (if applicable)
      if (HasReturnType(opcode)) {
        if (HasOnlyFloatReturnType(opcode) &&
            (!(_.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
               _.IsFloat16Vector2Or4Type(result_type)) &&
             !_.IsFloatScalarType(result_type))) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be float scalar type";
        } else if (HasOnlyIntReturnType(opcode) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer scalar type";
        } else if (HasIntOrFloatReturnType(opcode) &&
                   !_.IsFloatScalarType(result_type) &&
                   !(opcode == spv::Op::OpAtomicExchange &&
                     _.HasCapability(spv::Capability::AtomicFloat16VectorNV) &&
                     _.IsFloat16Vector2Or4Type(result_type)) &&
                   !_.IsIntScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be integer or float scalar type";
        } else if (HasOnlyBoolReturnType(opcode) &&
                   !_.IsBoolScalarType(result_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Result Type to be bool scalar type";
        }
      }

      uint32_t operand_index = HasReturnType(opcode) ? 2 : 0;
      const uint32_t pointer_type = _.GetOperandTypeId(inst, operand_index++);
      uint32_t data_type = 0;
      spv::StorageClass storage_class;
      if (!_.GetPointerTypeInfo(pointer_type, &data_type, &storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to be a pointer type";
      }

      // If the pointer is an untyped pointer, get the data type elsewhere.
      if (data_type == 0) {
        switch (opcode) {
          case spv::Op::OpAtomicLoad:
          case spv::Op::OpAtomicExchange:
          case spv::Op::OpAtomicFAddEXT:
          case spv::Op::OpAtomicCompareExchange:
          case spv::Op::OpAtomicCompareExchangeWeak:
          case spv::Op::OpAtomicIIncrement:
          case spv::Op::OpAtomicIDecrement:
          case spv::Op::OpAtomicIAdd:
          case spv::Op::OpAtomicISub:
          case spv::Op::OpAtomicSMin:
          case spv::Op::OpAtomicUMin:
          case spv::Op::OpAtomicFMinEXT:
          case spv::Op::OpAtomicSMax:
          case spv::Op::OpAtomicUMax:
          case spv::Op::OpAtomicFMaxEXT:
          case spv::Op::OpAtomicAnd:
          case spv::Op::OpAtomicOr:
          case spv::Op::OpAtomicXor:
            data_type = inst->type_id();
            break;
          case spv::Op::OpAtomicFlagTestAndSet:
          case spv::Op::OpAtomicFlagClear:
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Untyped pointers are not supported by atomic flag "
                      "instructions";
            break;
          case spv::Op::OpAtomicStore:
            data_type = _.FindDef(inst->GetOperandAs<uint32_t>(3))->type_id();
            break;
          default:
            break;
        }
      }

      // Can't use result_type because OpAtomicStore doesn't have a result
      if (_.IsIntScalarType(data_type) && _.GetBitWidth(data_type) == 64 &&
          !_.HasCapability(spv::Capability::Int64Atomics)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": 64-bit atomics require the Int64Atomics capability";
      }

      // Validate storage class against universal rules
      if (!IsStorageClassAllowedByUniversalRules(storage_class)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": storage class forbidden by universal validation rules.";
      }

      // Then Shader rules
      if (_.HasCapability(spv::Capability::Shader)) {
        // Vulkan environment rule
        if (spvIsVulkanEnv(_.context()->target_env)) {
          if ((storage_class != spv::StorageClass::Uniform) &&
              (storage_class != spv::StorageClass::StorageBuffer) &&
              (storage_class != spv::StorageClass::Workgroup) &&
              (storage_class != spv::StorageClass::Image) &&
              (storage_class != spv::StorageClass::PhysicalStorageBuffer) &&
              (storage_class != spv::StorageClass::TaskPayloadWorkgroupEXT)) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << _.VkErrorID(4686) << spvOpcodeString(opcode)
                   << ": Vulkan spec only allows storage classes for atomic to "
                      "be: Uniform, Workgroup, Image, StorageBuffer, "
                      "PhysicalStorageBuffer or TaskPayloadWorkgroupEXT.";
          }
        } else if (storage_class == spv::StorageClass::Function) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": Function storage class forbidden when the Shader "
                    "capability is declared.";
        }

        if (opcode == spv::Op::OpAtomicFAddEXT) {
          // result type being float checked already
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16AddEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float add atomics require the AtomicFloat32AddEXT "
                          "capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat32AddEXT "
                      "capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64AddEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float add atomics require the AtomicFloat64AddEXT "
                      "capability";
          }
        } else if (opcode == spv::Op::OpAtomicFMinEXT ||
                   opcode == spv::Op::OpAtomicFMaxEXT) {
          if (_.GetBitWidth(result_type) == 16) {
            if (_.IsFloat16Vector2Or4Type(result_type)) {
              if (!_.HasCapability(spv::Capability::AtomicFloat16VectorNV))
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float vector atomics require the "
                          "AtomicFloat16VectorNV capability";
            } else {
              if (!_.HasCapability(spv::Capability::AtomicFloat16MinMaxEXT)) {
                return _.diag(SPV_ERROR_INVALID_DATA, inst)
                       << spvOpcodeString(opcode)
                       << ": float min/max atomics require the "
                          "AtomicFloat16MinMaxEXT capability";
              }
            }
          }
          if ((_.GetBitWidth(result_type) == 32) &&
              (!_.HasCapability(spv::Capability::AtomicFloat32MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat32MinMaxEXT capability";
          }
          if ((_.GetBitWidth(result_type) == 64) &&
              (!_.HasCapability(spv::Capability::AtomicFloat64MinMaxEXT))) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << spvOpcodeString(opcode)
                   << ": float min/max atomics require the "
                      "AtomicFloat64MinMaxEXT capability";
          }
        }
      }

      // And finally OpenCL environment rules
      if (spvIsOpenCLEnv(_.context()->target_env)) {
        if ((storage_class != spv::StorageClass::Function) &&
            (storage_class != spv::StorageClass::Workgroup) &&
            (storage_class != spv::StorageClass::CrossWorkgroup) &&
            (storage_class != spv::StorageClass::Generic)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": storage class must be Function, Workgroup, "
                    "CrossWorkGroup or Generic in the OpenCL environment.";
        }

        if (_.context()->target_env == SPV_ENV_OPENCL_1_2) {
          if (storage_class == spv::StorageClass::Generic) {
            return _.diag(SPV_ERROR_INVALID_DATA, inst)
                   << "Storage class cannot be Generic in OpenCL 1.2 "
                      "environment";
          }
        }
      }

      // If result and pointer type are different, need to do special check here
      if (opcode == spv::Op::OpAtomicFlagTestAndSet ||
          opcode == spv::Op::OpAtomicFlagClear) {
        if (!_.IsIntScalarType(data_type) || _.GetBitWidth(data_type) != 32) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to point to a value of 32-bit integer "
                    "type";
        }
      } else if (opcode == spv::Op::OpAtomicStore) {
        if (!_.IsFloatScalarType(data_type) && !_.IsIntScalarType(data_type)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Pointer to be a pointer to integer or float "
                 << "scalar type";
        }
      } else if (data_type != result_type) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Pointer to point to a value of type Result "
                  "Type";
      }

      auto memory_scope = inst->GetOperandAs<const uint32_t>(operand_index++);
      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      const auto equal_semantics_index = operand_index++;
      if (auto error = ValidateMemorySemantics(_, inst, equal_semantics_index,
                                               memory_scope))
        return error;

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const auto unequal_semantics_index = operand_index++;
        if (auto error = ValidateMemorySemantics(
                _, inst, unequal_semantics_index, memory_scope))
          return error;

        // Volatile bits must match for equal and unequal semantics. Previous
        // checks guarantee they are 32-bit constants, but we need to recheck
        // whether they are evaluatable constants.
        bool is_int32 = false;
        bool is_equal_const = false;
        bool is_unequal_const = false;
        uint32_t equal_value = 0;
        uint32_t unequal_value = 0;
        std::tie(is_int32, is_equal_const, equal_value) = _.EvalInt32IfConst(
            inst->GetOperandAs<uint32_t>(equal_semantics_index));
        std::tie(is_int32, is_unequal_const, unequal_value) =
            _.EvalInt32IfConst(
                inst->GetOperandAs<uint32_t>(unequal_semantics_index));
        if (is_equal_const && is_unequal_const &&
            ((equal_value & uint32_t(spv::MemorySemanticsMask::Volatile)) ^
             (unequal_value & uint32_t(spv::MemorySemanticsMask::Volatile)))) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Volatile mask setting must match for Equal and Unequal "
                    "memory semantics";
        }
      }

      if (opcode == spv::Op::OpAtomicStore) {
        const uint32_t value_type = _.GetOperandTypeId(inst, 3);
        if (value_type != data_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value type and the type pointed to by "
                    "Pointer to be the same";
        }
      } else if (opcode != spv::Op::OpAtomicLoad &&
                 opcode != spv::Op::OpAtomicIIncrement &&
                 opcode != spv::Op::OpAtomicIDecrement &&
                 opcode != spv::Op::OpAtomicFlagTestAndSet &&
                 opcode != spv::Op::OpAtomicFlagClear) {
        const uint32_t value_type = _.GetOperandTypeId(inst, operand_index++);
        if (value_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Value to be of type Result Type";
        }
      }

      if (opcode == spv::Op::OpAtomicCompareExchange ||
          opcode == spv::Op::OpAtomicCompareExchangeWeak) {
        const uint32_t comparator_type =
            _.GetOperandTypeId(inst, operand_index++);
        if (comparator_type != result_type) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << spvOpcodeString(opcode)
                 << ": expected Comparator to be of type Result Type";
        }
      }

      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}